

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int set_flag(char pram)

{
  vm_register *pvVar1;
  char *pcVar2;
  char *ptr;
  char pram_local;
  
  pvVar1 = registe_ptr;
  pcVar2 = registe_ptr->flag;
  if (pram == '\0') {
    *pcVar2 = '\0';
    ptr._4_4_ = 1;
  }
  else if (pram < '\x01') {
    if (pram < '\0') {
      *pcVar2 = '\x01';
      pvVar1->flag[1] = '\0';
      ptr._4_4_ = 1;
    }
    else {
      ptr._4_4_ = 0xff;
    }
  }
  else {
    *pcVar2 = '\x01';
    pvVar1->flag[1] = '\x01';
    ptr._4_4_ = 1;
  }
  return ptr._4_4_;
}

Assistant:

int set_flag(char pram) {
	char * ptr = registe_ptr->flag;//获取flag指针
	if(pram== 0){
		ptr[0] = 0;
		return LVM_SUCCESS;
	}
	else if (pram > 0) {
		ptr[0] = 1;
		ptr[1] = 1;
		return LVM_SUCCESS;
	}else if(pram<0)
	{
		ptr[0] = 1;
		ptr[1] = 0;
		return LVM_SUCCESS;
	}
	return LVM_FAILD;
}